

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

int mtbdd_map_contains(MTBDDMAP map,uint32_t key)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int in_R10D;
  
  do {
    if (map == 0) {
      return 0;
    }
    uVar3 = (uint)(*(ulong *)(nodes->data + (map & 0xffffffffff) * 0x10 + 8) >> 0x28);
    if (uVar3 == key) {
      iVar2 = 1;
LAB_0010e031:
      in_R10D = iVar2;
      bVar1 = false;
    }
    else {
      iVar2 = 0;
      if (key < uVar3) goto LAB_0010e031;
      map = map & 0x8000000000000000 |
            *(ulong *)(nodes->data + (map & 0xffffffffff) * 0x10 + 8) & 0xffffffffff;
      bVar1 = true;
    }
    if (!bVar1) {
      return in_R10D;
    }
  } while( true );
}

Assistant:

int
mtbdd_map_contains(MTBDDMAP map, uint32_t key)
{
    while (!mtbdd_map_isempty(map)) {
        mtbddnode_t n = MTBDD_GETNODE(map);
        uint32_t k = mtbddnode_getvariable(n);
        if (k == key) return 1;
        if (k > key) return 0;
        map = node_getlow(map, n);
    }

    return 0;
}